

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O1

void __thiscall nvtt::OutputOptions::setFileName(OutputOptions *this,char *fileName)

{
  EVP_PKEY_CTX *src;
  StringBuilder local_20;
  
  nv::StringBuilder::StringBuilder(&local_20,fileName);
  nv::StringBuilder::copy((StringBuilder *)this->m,(EVP_PKEY_CTX *)&local_20,src);
  nv::StringBuilder::~StringBuilder(&local_20);
  this->m->outputHandler = (OutputHandler *)0x0;
  return;
}

Assistant:

void OutputOptions::setFileName(const char * fileName)
{
	m.fileName = fileName;
	m.outputHandler = NULL;
}